

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O3

long __thiscall mnf::RealSpace::getTypeId(RealSpace *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = utils::hash::computeHash_recurse<10>((char (*) [10])"RealSpace",0,0);
  uVar2 = (uVar1 >> 0x10 ^ uVar1) * -0x7a143595;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
  return (ulong)(uVar2 >> 0x10 ^ uVar2);
}

Assistant:

long RealSpace::getTypeId() const
{
  long typeId = utils::hash::computeHash("RealSpace");
  return typeId;
}